

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O2

void Ivy_GraphUpdateNetwork3
               (Ivy_Man_t *p,Ivy_Obj_t *pRoot,Dec_Graph_t *pGraph,int fUpdateLevel,int nGain)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  Ivy_Obj_t *pIVar6;
  int iVar7;
  
  iVar2 = p->nObjs[5];
  iVar3 = p->nObjs[6];
  for (iVar7 = 0; pVVar4 = *(Vec_Ptr_t **)((long)p->pData + 0x90), iVar7 < pVVar4->nSize;
      iVar7 = iVar7 + 1) {
    pvVar5 = Vec_PtrEntry(pVVar4,iVar7);
    piVar1 = (int *)(((ulong)pvVar5 & 0xfffffffffffffffe) + 0xc);
    *piVar1 = *piVar1 + 1;
  }
  iVar7 = pRoot->nRefs;
  pRoot->nRefs = 0;
  Ivy_ObjDelete_rec(p,pRoot,0);
  pRoot->nRefs = iVar7;
  for (iVar7 = 0; pVVar4 = *(Vec_Ptr_t **)((long)p->pData + 0x90), iVar7 < pVVar4->nSize;
      iVar7 = iVar7 + 1) {
    pvVar5 = Vec_PtrEntry(pVVar4,iVar7);
    Ivy_ObjRefsDec((Ivy_Obj_t *)((ulong)pvVar5 & 0xfffffffffffffffe));
  }
  pIVar6 = Ivy_GraphToNetwork(p,pGraph);
  Ivy_ObjReplace(p,pRoot,pIVar6,0,0,1);
  for (iVar7 = 0; pVVar4 = *(Vec_Ptr_t **)((long)p->pData + 0x90), iVar7 < pVVar4->nSize;
      iVar7 = iVar7 + 1) {
    pvVar5 = Vec_PtrEntry(pVVar4,iVar7);
    pIVar6 = (Ivy_Obj_t *)((ulong)pvVar5 & 0xfffffffffffffffe);
    if (((pIVar6->field_0x8 & 0xf) != 0) && (pIVar6->nRefs == 0)) {
      Ivy_ObjDelete_rec(p,pIVar6,1);
    }
  }
  if (nGain <= (iVar3 + iVar2) - (p->nObjs[5] + p->nObjs[6])) {
    return;
  }
  __assert_fail("nGain <= nNodesOld - nNodesNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                ,0x260,
                "void Ivy_GraphUpdateNetwork3(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int, int)");
}

Assistant:

void Ivy_GraphUpdateNetwork3( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain )
{
    Ivy_Obj_t * pRootNew, * pFanin;
    int nNodesNew, nNodesOld, i, nRefsOld;
    nNodesOld = Ivy_ManNodeNum(p);

//printf( "Before = %d. ", Ivy_ManNodeNum(p) );
    // mark the cut
    Vec_PtrForEachEntry( Ivy_Obj_t *, ((Rwt_Man_t *)p->pData)->vFanins, pFanin, i )
        Ivy_ObjRefsInc( Ivy_Regular(pFanin) );
    // deref the old cone
    nRefsOld = pRoot->nRefs;  
    pRoot->nRefs = 0;
    Ivy_ObjDelete_rec( p, pRoot, 0 );
    pRoot->nRefs = nRefsOld;
    // unmark the cut
    Vec_PtrForEachEntry( Ivy_Obj_t *, ((Rwt_Man_t *)p->pData)->vFanins, pFanin, i )
        Ivy_ObjRefsDec( Ivy_Regular(pFanin) );
//printf( "Deref = %d. ", Ivy_ManNodeNum(p) );
 
    // create the new structure of nodes
    pRootNew = Ivy_GraphToNetwork( p, pGraph );
//printf( "Create = %d. ", Ivy_ManNodeNum(p) );
    // remove the old nodes
//    Ivy_AigReplace( pMan->pManFunc, pRoot, pRootNew, fUpdateLevel );
/*
    if ( Ivy_IsComplement(pRootNew) )
        printf( "c" );
    else
        printf( "d" );
    if ( Ivy_ObjRefs(Ivy_Regular(pRootNew)) > 0 )
        printf( "%d", Ivy_ObjRefs(Ivy_Regular(pRootNew)) );
    printf( " " );
*/
    Ivy_ObjReplace( p, pRoot, pRootNew, 0, 0, 1 );
//printf( "Replace = %d. ", Ivy_ManNodeNum(p) );

    // delete remaining dangling nodes
    Vec_PtrForEachEntry( Ivy_Obj_t *, ((Rwt_Man_t *)p->pData)->vFanins, pFanin, i )
    {
        pFanin = Ivy_Regular(pFanin);
        if ( !Ivy_ObjIsNone(pFanin) && Ivy_ObjRefs(pFanin) == 0 )
            Ivy_ObjDelete_rec( p, pFanin, 1 );
    }
//printf( "Deref = %d. ", Ivy_ManNodeNum(p) );
//printf( "\n" );

    // compare the gains
    nNodesNew = Ivy_ManNodeNum(p);
    assert( nGain <= nNodesOld - nNodesNew );
}